

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

void testExistingStreams(string *tempDir)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar1;
  void *this;
  exception *e;
  Array2D<Imf_3_2::Rgba> p1;
  int compression;
  int H;
  int W;
  Array2D<Imf_3_2::Rgba> *in_stack_000003d8;
  int in_stack_000003e0;
  int in_stack_000003e4;
  Array2D<Imf_3_2::Rgba> *in_stack_000003f8;
  int in_stack_00000400;
  int in_stack_00000404;
  Array2D<Imf_3_2::Rgba> *in_stack_000005f8;
  Compression in_stack_00000604;
  int in_stack_00000608;
  int in_stack_0000060c;
  char *in_stack_00000610;
  Array2D<Imf_3_2::Rgba> *in_stack_00000638;
  Compression in_stack_00000644;
  int in_stack_00000648;
  int in_stack_0000064c;
  char *in_stack_00000650;
  Array2D<Imf_3_2::Rgba> *in_stack_00000738;
  int in_stack_00000740;
  int in_stack_00000744;
  Array2D<Imf_3_2::Rgba> *in_stack_00000a58;
  Compression in_stack_00000a64;
  int in_stack_00000a68;
  int in_stack_00000a6c;
  char *in_stack_00000a70;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff40;
  string local_98 [8];
  long in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff80;
  string local_78 [32];
  string local_58 [56];
  int local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<((ostream *)&std::cout,"Testing reading and writing using existing streams"
                         );
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  local_18 = 0x77;
  local_1c = 0xed;
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"compression: ");
    this = (void *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    anon_unknown.dwarf_f2985::fillPixels1
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    std::operator+(__lhs,(char *)poVar1);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_f2985::writeReadScanLines
              (in_stack_00000650,in_stack_0000064c,in_stack_00000648,in_stack_00000644,
               in_stack_00000638);
    std::__cxx11::string::~string(local_58);
    anon_unknown.dwarf_f2985::writeReadScanLines
              (in_stack_000003e4,in_stack_000003e0,in_stack_000003d8);
    anon_unknown.dwarf_f2985::fillPixels2
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    std::operator+(__lhs,(char *)poVar1);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_f2985::writeReadTiles
              (in_stack_00000610,in_stack_0000060c,in_stack_00000608,in_stack_00000604,
               in_stack_000005f8);
    std::__cxx11::string::~string(local_78);
    anon_unknown.dwarf_f2985::writeReadTiles(in_stack_00000404,in_stack_00000400,in_stack_000003f8);
    anon_unknown.dwarf_f2985::fillPixels1
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    std::operator+(__lhs,(char *)poVar1);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_f2985::writeReadMultiPart
              (in_stack_00000a70,in_stack_00000a6c,in_stack_00000a68,in_stack_00000a64,
               in_stack_00000a58);
    std::__cxx11::string::~string(local_98);
    anon_unknown.dwarf_f2985::writeReadMultiPart
              (in_stack_00000744,in_stack_00000740,in_stack_00000738);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_ffffffffffffff30);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
               (tempDir + "imf_test_streams.exr").c_str (),
               W,
               H,
               static_cast<Compression>(compression),
               p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
               (tempDir + "imf_test_streams2.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
               (tempDir + "imf_test_streams3.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}